

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindRValue
          (Type *lhs,ExpressionSyntax *rhs,SourceRange assignmentRange,ASTContext *context,
          bitmask<slang::ast::ASTFlags> extraFlags)

{
  SourceRange assignmentRange_00;
  SourceRange assignmentRange_01;
  bool bVar1;
  Expression *pEVar2;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  ASTContext *in_R8;
  underlying_type in_R9;
  Expression *expr;
  InstanceSymbolBase *instance;
  Expression *ref;
  ASTContext ctx;
  Compilation *comp;
  ASTContext *in_stack_000000e0;
  ExpressionSyntax *in_stack_000000e8;
  Compilation *in_stack_000000f0;
  bitmask<slang::ast::ASTFlags> in_stack_000000f8;
  undefined1 in_stack_00000a4f;
  ExpressionSyntax *in_stack_00000a50;
  ASTContext *in_stack_00000a58;
  Type *in_stack_ffffffffffffff20;
  ASTContext *in_stack_ffffffffffffff28;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff30;
  bitmask<slang::ast::ASTFlags> local_b0;
  InstanceSymbolBase *local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  SourceLocation local_90;
  Expression *local_88;
  underlying_type local_80;
  Compilation *local_40;
  ASTContext *local_38;
  bitmask<slang::ast::ASTFlags> local_20;
  SourceRange local_18;
  
  local_38 = in_R8;
  local_20.m_bits = in_R9;
  local_18.startLoc = in_RDX;
  local_18.endLoc = in_RCX;
  local_40 = ASTContext::getCompilation((ASTContext *)0x8a1e64);
  local_80 = local_20.m_bits;
  ASTContext::resetFlags(in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  bVar1 = Type::isVirtualInterfaceOrArray(in_stack_ffffffffffffff20);
  if (bVar1) {
    local_88 = tryBindInterfaceRef(in_stack_00000a58,in_stack_00000a50,(bool)in_stack_00000a4f);
    if (local_88 != (Expression *)0x0) {
      local_90 = SourceRange::start(&local_18);
      bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x8a1ee7);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_18.startLoc = (local_88->sourceRange).startLoc;
        local_18.endLoc = (local_88->sourceRange).endLoc;
      }
      local_a0 = local_18.startLoc;
      local_98 = local_18.endLoc;
      assignmentRange_00.endLoc = (SourceLocation)extraFlags.m_bits;
      assignmentRange_00.startLoc = (SourceLocation)lhs;
      pEVar2 = convertAssignment((ASTContext *)rhs,(Type *)context,(Expression *)comp,
                                 assignmentRange_00,(Expression **)ctx.assertionInstance,
                                 (bitmask<slang::ast::AssignFlags> *)in_stack_000000e0);
      return pEVar2;
    }
    local_88 = (Expression *)0x0;
  }
  local_a8 = ASTContext::getInstance(local_38);
  if ((local_a8 == (InstanceSymbolBase *)0x0) ||
     (bVar1 = std::span<const_unsigned_int,_18446744073709551615UL>::empty
                        ((span<const_unsigned_int,_18446744073709551615UL> *)0x8a1f8b), bVar1)) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,StreamingAllowed);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_20,&local_b0);
  }
  pEVar2 = create(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000f8,
                  (Type *)assignmentRange.endLoc);
  SourceRange::start(&local_18);
  bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x8a2007);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_18.startLoc = (pEVar2->sourceRange).startLoc;
    local_18.endLoc = (pEVar2->sourceRange).endLoc;
  }
  assignmentRange_01.endLoc = (SourceLocation)extraFlags.m_bits;
  assignmentRange_01.startLoc = (SourceLocation)lhs;
  pEVar2 = convertAssignment((ASTContext *)rhs,(Type *)context,(Expression *)comp,assignmentRange_01
                             ,(Expression **)ctx.assertionInstance,
                             (bitmask<slang::ast::AssignFlags> *)in_stack_000000e0);
  return pEVar2;
}

Assistant:

const Expression& Expression::bindRValue(const Type& lhs, const ExpressionSyntax& rhs,
                                         SourceRange assignmentRange, const ASTContext& context,
                                         bitmask<ASTFlags> extraFlags) {
    Compilation& comp = context.getCompilation();

    ASTContext ctx = context.resetFlags(extraFlags);
    if (lhs.isVirtualInterfaceOrArray()) {
        if (auto ref = tryBindInterfaceRef(ctx, rhs, /* isInterfacePort */ false)) {
            if (!assignmentRange.start())
                assignmentRange = ref->sourceRange;
            return convertAssignment(ctx, lhs, *ref, assignmentRange);
        }
    }

    auto instance = context.getInstance();
    if (!instance || instance->arrayPath.empty())
        extraFlags |= ASTFlags::StreamingAllowed;

    Expression& expr = create(comp, rhs, ctx, extraFlags, &lhs);
    if (!assignmentRange.start())
        assignmentRange = expr.sourceRange;

    return convertAssignment(ctx, lhs, expr, assignmentRange);
}